

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QtDependency>::relocate
          (QArrayDataPointer<QtDependency> *this,qsizetype offset,QtDependency **data)

{
  bool bVar1;
  QtDependency *in_RDX;
  long in_RSI;
  QtDependency *in_RDI;
  QtDependency **unaff_retaddr;
  QtDependency *res;
  char16_t *n;
  QtDependency *c;
  
  n = (in_RDI->relativePath).d.ptr + in_RSI * 0x18;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QtDependency,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (QtDependency *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QtDependency>,QtDependency_const*>
                        (unaff_retaddr,(QArrayDataPointer<QtDependency> *)c), bVar1)) {
    (in_RDX->relativePath).d.d = (in_RDX->relativePath).d.d + in_RSI * 3;
  }
  (in_RDI->relativePath).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }